

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d * tinyusdz::orthonormalize(matrix3d *__return_storage_ptr__,matrix3d *m,bool *result_valid)

{
  bool bVar1;
  reference pvVar2;
  matrix3d *ret;
  undefined1 auStack_60 [7];
  bool result;
  double3 r2;
  double3 r1;
  double3 r0;
  bool *result_valid_local;
  matrix3d *m_local;
  
  value::matrix3d::identity();
  r1._M_elems[2] = m->m[0][0];
  r2._M_elems[2] = m->m[1][0];
  r1._M_elems[0] = m->m[1][1];
  r1._M_elems[1] = m->m[1][2];
  _auStack_60 = m->m[2][0];
  r2._M_elems[0] = m->m[2][1];
  r2._M_elems[1] = m->m[2][2];
  bVar1 = orthonormalize_basis
                    ((double3 *)(r1._M_elems + 2),(double3 *)(r2._M_elems + 2),(double3 *)auStack_60
                     ,true,1e-06);
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r1._M_elems + 2),0);
  __return_storage_ptr__->m[0][0] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r1._M_elems + 2),1);
  __return_storage_ptr__->m[0][1] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r1._M_elems + 2),2);
  __return_storage_ptr__->m[0][2] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r2._M_elems + 2),0);
  __return_storage_ptr__->m[1][0] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r2._M_elems + 2),1);
  __return_storage_ptr__->m[1][1] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r2._M_elems + 2),2);
  __return_storage_ptr__->m[1][2] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)auStack_60,0);
  __return_storage_ptr__->m[2][0] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)auStack_60,1);
  __return_storage_ptr__->m[2][1] = *pvVar2;
  pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)auStack_60,2);
  __return_storage_ptr__->m[2][2] = *pvVar2;
  if (result_valid != (bool *)0x0) {
    *result_valid = bVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d orthonormalize(const value::matrix3d &m, bool *result_valid) {
  value::matrix3d ret = value::matrix3d::identity();

  // orthogonalize and normalize row vectors
  value::double3 r0{m.m[0][0], m.m[0][1], m.m[0][2]};
  value::double3 r1{m.m[1][0], m.m[1][1], m.m[1][2]};
  value::double3 r2{m.m[2][0], m.m[2][1], m.m[2][2]};
  bool result = orthonormalize_basis(r0, r1, r2, true);
  ret.m[0][0] = r0[0];
  ret.m[0][1] = r0[1];
  ret.m[0][2] = r0[2];
  ret.m[1][0] = r1[0];
  ret.m[1][1] = r1[1];
  ret.m[1][2] = r1[2];
  ret.m[2][0] = r2[0];
  ret.m[2][1] = r2[1];
  ret.m[2][2] = r2[2];

  if (result_valid) {
    (*result_valid) = result;
    // TF_WARN("OrthogonalizeBasis did not converge, matrix may not be "
    //               "orthonormal.");
  }

  return ret;
}